

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O0

void __thiscall
AI::HierarchicalTaskNetworkComponent::perceiveVisual(HierarchicalTaskNetworkComponent *this)

{
  bool bVar1;
  vector<AI::Engram,_std::allocator<AI::Engram>_> *this_00;
  mapped_type *pmVar2;
  byte local_61;
  __normal_iterator<AI::Actor_**,_std::vector<AI::Actor_*,_std::allocator<AI::Actor_*>_>_> local_58;
  Actor **local_50;
  __normal_iterator<AI::Actor_**,_std::vector<AI::Actor_*,_std::allocator<AI::Actor_*>_>_> local_48;
  __normal_iterator<AI::Actor_**,_std::vector<AI::Actor_*,_std::allocator<AI::Actor_*>_>_> local_40;
  key_type local_34;
  reference local_30;
  Engram *engram;
  iterator __end1;
  iterator __begin1;
  vector<AI::Engram,_std::allocator<AI::Engram>_> *__range1;
  HierarchicalTaskNetworkComponent *this_local;
  
  this_00 = &(this->state).memory.shortTermMemory;
  __end1 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::begin(this_00);
  engram = (Engram *)std::vector<AI::Engram,_std::allocator<AI::Engram>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>
                                     *)&engram), bVar1) {
    local_30 = __gnu_cxx::
               __normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>
               ::operator*(&__end1);
    if ((local_30->type == Saw) && (local_30->age < 1)) {
      local_61 = 0;
      if ((local_30->stimulus).field_3.visual.tag == Person) {
        local_34 = PlayerIdentified;
        pmVar2 = std::
                 map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                 ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                               *)&this->state,&local_34);
        local_61 = *pmVar2;
      }
      if ((local_61 & 1) == 0) {
        local_48._M_current =
             (Actor **)
             std::begin<std::vector<AI::Actor*,std::allocator<AI::Actor*>>>
                       (&(this->state).actorsToIgnore);
        local_50 = (Actor **)
                   std::end<std::vector<AI::Actor*,std::allocator<AI::Actor*>>>
                             (&(this->state).actorsToIgnore);
        local_40 = std::
                   find<__gnu_cxx::__normal_iterator<AI::Actor**,std::vector<AI::Actor*,std::allocator<AI::Actor*>>>,AI::Actor*>
                             (local_48,(__normal_iterator<AI::Actor_**,_std::vector<AI::Actor_*,_std::allocator<AI::Actor_*>_>_>
                                        )local_50,&(local_30->stimulus).field_3.visual.target);
        local_58._M_current =
             (Actor **)
             std::end<std::vector<AI::Actor*,std::allocator<AI::Actor*>>>
                       (&(this->state).actorsToIgnore);
        bVar1 = __gnu_cxx::operator==(&local_40,&local_58);
        if (bVar1) {
          addEngramToLocus(this,local_30);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::perceiveVisual()
{
	for (auto& engram : state.memory.shortTermMemory)
	{
		if (engram.type != EngramType::Saw)
			continue;

		if (engram.age > 0)
			continue;

		if (engram.stimulus.visual.tag == VisualTag::Person
			&& state.current.flags[WorldStateIdentifier::PlayerIdentified])		
			continue;

		if (std::find(begin(state.actorsToIgnore), end(state.actorsToIgnore), engram.stimulus.visual.target)
			== end(state.actorsToIgnore))
		{
			addEngramToLocus(engram);
		}		
	}	
}